

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O1

HTS_Boolean
HTS_get_token_from_string_with_separator(char *str,size_t *index,char *buff,char separator)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  
  if ((str == (char *)0x0) || (cVar1 = str[*index], cVar1 == '\0')) {
    return '\0';
  }
  if (cVar1 == separator) {
    sVar2 = *index;
    cVar1 = '\x01';
    do {
      sVar2 = sVar2 + 1;
      if (cVar1 == '\0') {
        return '\0';
      }
      *index = sVar2;
      cVar1 = str[sVar2];
    } while (cVar1 == separator);
  }
  bVar4 = cVar1 != '\0';
  if (bVar4 && cVar1 != separator) {
    lVar3 = 0;
    do {
      buff[lVar3] = cVar1;
      lVar3 = lVar3 + 1;
      sVar2 = *index;
      *index = sVar2 + 1;
      cVar1 = str[sVar2 + 1];
      bVar4 = cVar1 != '\0';
      if (cVar1 == separator) break;
    } while (cVar1 != '\0');
  }
  else {
    lVar3 = 0;
  }
  if (bVar4) {
    *index = *index + 1;
  }
  buff[lVar3] = '\0';
  return lVar3 != 0;
}

Assistant:

HTS_Boolean HTS_get_token_from_string_with_separator(const char *str, size_t * index, char *buff, char separator)
{
   char c;
   size_t len = 0;

   if (str == NULL)
      return FALSE;

   c = str[(*index)];
   if (c == '\0')
      return FALSE;
   while (c == separator) {
      if (c == '\0')
         return FALSE;
      (*index)++;
      c = str[(*index)];
   }
   while (c != separator && c != '\0') {
      buff[len++] = c;
      (*index)++;
      c = str[(*index)];
   }
   if (c != '\0')
      (*index)++;

   buff[len] = '\0';

   if (len > 0)
      return TRUE;
   else
      return FALSE;
}